

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O2

void __thiscall tvm::runtime::TVMRetValue::Clear(TVMRetValue *this)

{
  ExtTypeVTable *pEVar1;
  int type_code;
  _Function_base *this_00;
  ulong uStack_20;
  
  type_code = (this->super_TVMPODValue_).type_code_;
  switch(type_code) {
  case 4:
    return;
  default:
    goto switchD_00108a0c_caseD_5;
  case 8:
    this_00 = (_Function_base *)(this->super_TVMPODValue_).value_.v_handle;
    if (this_00 != (_Function_base *)0x0) {
      NodePtr<tvm::Node>::~NodePtr((NodePtr<tvm::Node> *)this_00);
    }
    uStack_20 = 8;
    break;
  case 9:
    this_00 = (_Function_base *)(this->super_TVMPODValue_).value_.v_handle;
    if (this_00 != (_Function_base *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&this_00->_M_functor + 8));
    }
    uStack_20 = 0x10;
    break;
  case 10:
    this_00 = (_Function_base *)(this->super_TVMPODValue_).value_.v_handle;
    if (this_00 != (_Function_base *)0x0) {
      std::_Function_base::~_Function_base(this_00);
    }
    goto LAB_00108a63;
  case 0xb:
    this_00 = (_Function_base *)(this->super_TVMPODValue_).value_.v_handle;
    if (this_00 != (_Function_base *)0x0) {
      std::__cxx11::string::~string((string *)this_00);
    }
LAB_00108a63:
    uStack_20 = 0x20;
    break;
  case 0xd:
    NDArray::Container::DecRef((Container *)(this->super_TVMPODValue_).value_.v_handle);
    goto LAB_00108a6e;
  }
  operator_delete(this_00,uStack_20);
LAB_00108a6e:
  type_code = (this->super_TVMPODValue_).type_code_;
switchD_00108a0c_caseD_5:
  if (0xf < type_code) {
    pEVar1 = ExtTypeVTable::Get(type_code);
    (*pEVar1->destroy)((this->super_TVMPODValue_).value_.v_handle);
  }
  (this->super_TVMPODValue_).type_code_ = 4;
  return;
}

Assistant:

void Clear() {
    if (type_code_ == kNull)
      return;
    switch (type_code_) {
    case kStr:
      delete ptr<std::string>();
      break;
    case kFuncHandle:
      delete ptr<PackedFunc>();
      break;
    case kModuleHandle:
      delete ptr<Module>();
      break;
    case kNodeHandle:
      delete ptr<NodePtr<Node>>();
      break;
    case kNDArrayContainer: {
      static_cast<NDArray::Container *>(value_.v_handle)->DecRef();
      break;
    }
    }
    if (type_code_ > kExtBegin) {
#if TVM_RUNTIME_HEADER_ONLY
      LOG(FATAL) << "Header only mode do not support ext type";
#else
      (*(ExtTypeVTable::Get(type_code_)->destroy))(value_.v_handle);
#endif
    }
    type_code_ = kNull;
  }